

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_> *this)

{
  uint uVar1;
  locale *plVar2;
  uint uVar3;
  num_writer f;
  undefined1 uVar4;
  uint uVar5;
  numpunct *pnVar6;
  uint uVar7;
  string_view prefix;
  locale local_48 [8];
  unsigned_type local_40;
  int iStack_3c;
  undefined4 local_38;
  
  uVar1 = this->abs_value;
  uVar3 = 0x1f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar7 = (uVar3 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar3 = *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 + (ulong)uVar7 * 4);
  plVar2 = (locale *)(this->writer->locale_).locale_;
  if (plVar2 == (locale *)0x0) {
    std::locale::locale(local_48);
  }
  else {
    std::locale::locale(local_48,plVar2);
  }
  pnVar6 = std::use_facet<std::__cxx11::numpunct<char>>(local_48);
  uVar4 = (**(code **)(*(long *)pnVar6 + 0x18))(pnVar6);
  std::locale::~locale(local_48);
  uVar5 = (char)((char)uVar7 - (uVar1 < uVar3)) * 0x56;
  iStack_3c = (uVar3 <= uVar1) + uVar7 +
              (uint)(byte)((char)((uVar5 & 0xffff) >> 0xf) + (char)(uVar5 >> 8));
  local_40 = this->abs_value;
  local_38 = CONCAT31(local_38._1_3_,uVar4);
  f.size = iStack_3c;
  f.abs_value = local_40;
  f._8_4_ = local_38;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this->writer,iStack_3c,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }